

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode,
          bool testOkToFail)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pAVar3;
  AssertionStats *stats;
  pointer puVar4;
  StringRef attribute;
  StringRef text;
  StringRef text_00;
  StringRef attribute_00;
  StringRef attribute_01;
  bool bVar5;
  long *plVar6;
  size_type *psVar7;
  AssertionOrBenchmarkResult *assertionOrBenchmark;
  pointer pAVar8;
  pointer puVar9;
  char *__end;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  StringRef name_04;
  StringRef name_05;
  StringRef name_06;
  StringRef attribute_02;
  StringRef attribute_03;
  StringRef attribute_04;
  StringRef attribute_05;
  __string_type __str;
  string name;
  ScopedElement e;
  string local_c0;
  undefined1 local_a0 [16];
  undefined1 local_90 [24];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [8];
  _anonymous_namespace_ *this_01;
  
  local_90._16_8_ = this;
  trim((string *)local_68,(string *)sectionNode);
  if (rootName->_M_string_length != 0) {
    pcVar2 = (rootName->_M_dataplus)._M_p;
    local_a0._0_8_ = (XmlWriter *)local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pcVar2,pcVar2 + rootName->_M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)local_a0,local_a0._8_8_,0,'\x01');
    plVar6 = (long *)std::__cxx11::string::_M_append(local_a0,local_68._0_8_);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_c0.field_2._M_allocated_capacity = *psVar7;
      local_c0.field_2._8_8_ = plVar6[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar7;
      local_c0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_c0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((XmlWriter *)local_a0._0_8_ != (XmlWriter *)local_90) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
    }
  }
  bVar5 = CumulativeReporterBase::SectionNode::hasAnyAssertions(sectionNode);
  local_48 = (undefined1  [8])className;
  if (((bVar5) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"testcase","");
    this_00 = (XmlWriter *)(local_90._16_8_ + 0xb0);
    XmlWriter::scopedElement
              ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_00,(XmlFormatting)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (className->_M_string_length == 0) {
      attribute_01.m_size = local_68._8_8_;
      attribute_01.m_start = (char *)local_68._0_8_;
      name_02.m_size = 9;
      name_02.m_start = "classname";
      XmlWriter::writeAttribute(this_00,name_02,attribute_01);
      name_03.m_size = 4;
      name_03.m_start = "name";
      this_01 = (_anonymous_namespace_ *)0x17fc38;
      attribute_03.m_size = 4;
      attribute_03.m_start = "root";
      XmlWriter::writeAttribute(this_00,name_03,attribute_03);
    }
    else {
      name_00.m_size = 9;
      name_00.m_start = "classname";
      attribute_02.m_size = className->_M_string_length;
      attribute_02.m_start = (className->_M_dataplus)._M_p;
      XmlWriter::writeAttribute(this_00,name_00,attribute_02);
      attribute_00.m_size = local_68._8_8_;
      attribute_00.m_start = (char *)local_68._0_8_;
      name_01.m_size = 4;
      name_01.m_start = "name";
      this_01 = (_anonymous_namespace_ *)0x17fc38;
      XmlWriter::writeAttribute(this_00,name_01,attribute_00);
    }
    (anonymous_namespace)::formatDuration_abi_cxx11_
              (&local_c0,this_01,(sectionNode->stats).durationInSeconds);
    attribute.m_size = local_c0._M_string_length;
    attribute.m_start = local_c0._M_dataplus._M_p;
    name_04.m_size = 4;
    name_04.m_start = "time";
    XmlWriter::writeAttribute(this_00,name_04,attribute);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    name_05.m_size = 6;
    name_05.m_start = "status";
    attribute_04.m_size = 3;
    attribute_04.m_start = "run";
    XmlWriter::writeAttribute(this_00,name_05,attribute_04);
    if ((sectionNode->stats).assertions.failedButOk != 0) {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"skipped","");
      XmlWriter::scopedElement((XmlWriter *)local_a0,(string *)this_00,(XmlFormatting)&local_c0);
      name_06.m_size = 7;
      name_06.m_start = "message";
      attribute_05.m_size = 0x1e;
      attribute_05.m_start = "TEST_CASE tagged with !mayfail";
      XmlWriter::writeAttribute((XmlWriter *)local_a0._0_8_,name_06,attribute_05);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    pAVar3 = (sectionNode->assertionsAndBenchmarks).
             super__Vector_base<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar8 = (sectionNode->assertionsAndBenchmarks).
                  super__Vector_base<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar8 != pAVar3; pAVar8 = pAVar8 + 1)
    {
      stats = (pAVar8->m_assertion).nullableValue;
      if (stats != (AssertionStats *)0x0) {
        writeAssertion((JunitReporter *)local_90._16_8_,stats);
      }
    }
    if ((sectionNode->stdOut)._M_string_length != 0) {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"system-out","");
      XmlWriter::scopedElement((XmlWriter *)local_78,(string *)this_00,(XmlFormatting)&local_c0);
      trim((string *)local_a0,&sectionNode->stdOut);
      text.m_size = local_a0._8_8_;
      text.m_start = (char *)local_a0._0_8_;
      XmlWriter::writeText((XmlWriter *)local_78._0_8_,text,Newline);
      if ((XmlWriter *)local_a0._0_8_ != (XmlWriter *)local_90) {
        operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((sectionNode->stdErr)._M_string_length != 0) {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"system-err","");
      XmlWriter::scopedElement((XmlWriter *)local_78,(string *)this_00,(XmlFormatting)&local_c0);
      trim((string *)local_a0,&sectionNode->stdErr);
      text_00.m_size = local_a0._8_8_;
      text_00.m_start = (char *)local_a0._0_8_;
      XmlWriter::writeText((XmlWriter *)local_78._0_8_,text_00,Newline);
      if ((XmlWriter *)local_a0._0_8_ != (XmlWriter *)local_90) {
        operator_delete((void *)local_a0._0_8_,(ulong)(local_90._0_8_ + 1));
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  }
  puVar9 = (sectionNode->childSections).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (sectionNode->childSections).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar4) {
    do {
      if (*(size_type *)((long)local_48 + 8) == 0) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"","");
        writeSection((JunitReporter *)local_90._16_8_,(string *)local_68,&local_c0,puVar9->m_ptr,
                     testOkToFail);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        writeSection((JunitReporter *)local_90._16_8_,(string *)local_48,(string *)local_68,
                     puVar9->m_ptr,testOkToFail);
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._0_8_ != &local_58) {
    operator_delete((void *)local_68._0_8_,local_58._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JunitReporter::writeSection( std::string const& className,
                                      std::string const& rootName,
                                      SectionNode const& sectionNode,
                                      bool testOkToFail) {
        std::string name = trim( sectionNode.stats.sectionInfo.name );
        if( !rootName.empty() )
            name = rootName + '/' + name;

        if( sectionNode.hasAnyAssertions()
           || !sectionNode.stdOut.empty()
           || !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
            if( className.empty() ) {
                xml.writeAttribute( "classname"_sr, name );
                xml.writeAttribute( "name"_sr, "root"_sr );
            }
            else {
                xml.writeAttribute( "classname"_sr, className );
                xml.writeAttribute( "name"_sr, name );
            }
            xml.writeAttribute( "time"_sr, formatDuration( sectionNode.stats.durationInSeconds ) );
            // This is not ideal, but it should be enough to mimic gtest's
            // junit output.
            // Ideally the JUnit reporter would also handle `skipTest`
            // events and write those out appropriately.
            xml.writeAttribute( "status"_sr, "run"_sr );

            if (sectionNode.stats.assertions.failedButOk) {
                xml.scopedElement("skipped")
                    .writeAttribute("message", "TEST_CASE tagged with !mayfail");
            }

            writeAssertions( sectionNode );


            if( !sectionNode.stdOut.empty() )
                xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), XmlFormatting::Newline );
            if( !sectionNode.stdErr.empty() )
                xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), XmlFormatting::Newline );
        }
        for( auto const& childNode : sectionNode.childSections )
            if( className.empty() )
                writeSection( name, "", *childNode, testOkToFail );
            else
                writeSection( className, name, *childNode, testOkToFail );
    }